

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_info_ext_key_usage(char **buf,size_t *size,mbedtls_x509_sequence *extended_key_usage)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  size_t __maxlen;
  char *pcVar4;
  char *__s;
  bool bVar5;
  char *desc;
  char *local_48;
  size_t *local_40;
  char **local_38;
  
  __maxlen = *size;
  __s = *buf;
  local_40 = size;
  local_38 = buf;
  if (extended_key_usage != (mbedtls_x509_sequence *)0x0) {
    pcVar4 = anon_var_dwarf_10fc7 + 9;
    do {
      iVar1 = mbedtls_oid_get_extended_key_usage(&extended_key_usage->buf,&local_48);
      if (iVar1 != 0) {
        local_48 = "???";
      }
      uVar2 = snprintf(__s,__maxlen,"%s%s",pcVar4,local_48);
      if ((int)uVar2 < 0) {
        return -0x2980;
      }
      uVar3 = (ulong)uVar2;
      bVar5 = __maxlen < uVar3;
      __maxlen = __maxlen - uVar3;
      if (bVar5 || __maxlen == 0) {
        return -0x2980;
      }
      __s = __s + uVar3;
      extended_key_usage = extended_key_usage->next;
      pcVar4 = ", ";
    } while (extended_key_usage != (mbedtls_asn1_sequence *)0x0);
  }
  *local_40 = __maxlen;
  *local_38 = __s;
  return 0;
}

Assistant:

static int x509_info_ext_key_usage( char **buf, size_t *size,
                                    const mbedtls_x509_sequence *extended_key_usage )
{
    int ret;
    const char *desc;
    size_t n = *size;
    char *p = *buf;
    const mbedtls_x509_sequence *cur = extended_key_usage;
    const char *sep = "";

    while( cur != NULL )
    {
        if( mbedtls_oid_get_extended_key_usage( &cur->buf, &desc ) != 0 )
            desc = "???";

        ret = mbedtls_snprintf( p, n, "%s%s", sep, desc );
        MBEDTLS_X509_SAFE_SNPRINTF;

        sep = ", ";

        cur = cur->next;
    }

    *size = n;
    *buf = p;

    return( 0 );
}